

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O2

char * ucurr_nextCurrencyList(UEnumeration *enumerator,int32_t *resultLength,UErrorCode *param_3)

{
  uint *puVar1;
  uint32_t *puVar2;
  ulong uVar3;
  uint32_t *puVar4;
  
  puVar1 = (uint *)enumerator->context;
  uVar3 = (ulong)puVar1[1];
  puVar2 = &gCurrencyList[uVar3].currType;
  do {
    puVar4 = puVar2;
    if (0x12e < uVar3) {
      if (resultLength != (int32_t *)0x0) {
        *resultLength = 0;
      }
      return (char *)0x0;
    }
    puVar1[1] = (int)uVar3 + 1;
    if (*puVar1 == 0x7fffffff) break;
    uVar3 = uVar3 + 1;
    puVar2 = puVar4 + 4;
  } while ((*puVar1 & ~*puVar4) != 0);
  if (resultLength != (int32_t *)0x0) {
    *resultLength = 3;
  }
  return ((CurrencyList *)(puVar4 + -2))->currency;
}

Assistant:

static const char* U_CALLCONV
ucurr_nextCurrencyList(UEnumeration *enumerator,
                        int32_t* resultLength,
                        UErrorCode * /*pErrorCode*/)
{
    UCurrencyContext *myContext = (UCurrencyContext *)(enumerator->context);

    /* Find the next in the list that matches the type we are looking for. */
    while (myContext->listIdx < UPRV_LENGTHOF(gCurrencyList)-1) {
        const struct CurrencyList *currItem = &gCurrencyList[myContext->listIdx++];
        if (UCURR_MATCHES_BITMASK(currItem->currType, myContext->currType))
        {
            if (resultLength) {
                *resultLength = 3; /* Currency codes are only 3 chars long */
            }
            return currItem->currency;
        }
    }
    /* We enumerated too far. */
    if (resultLength) {
        *resultLength = 0;
    }
    return NULL;
}